

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

FromBase64Result * QByteArray::fromBase64Encoding(QByteArray *base64,Base64Options options)

{
  QByteArray *in_RSI;
  FromBase64Result *in_RDI;
  long in_FS_OFFSET;
  fromBase64_helper_result fVar1;
  qsizetype base64Size;
  fromBase64_helper_result base64result;
  QByteArray result;
  QByteArray *in_stack_ffffffffffffff48;
  QByteArray *in_stack_ffffffffffffff50;
  FromBase64Result *pFVar2;
  QByteArray *in_stack_ffffffffffffff78;
  Data *output;
  char *inputSize;
  char *input;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar2 = in_RDI;
  size(in_RSI);
  input = &DAT_aaaaaaaaaaaaaaaa;
  output = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  inputSize = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(in_stack_ffffffffffffff78,(qsizetype)&stack0xffffffffffffffd8,
             (Initialization)((ulong)pFVar2 >> 0x20));
  data(in_stack_ffffffffffffff50);
  constData((QByteArray *)0x4b9fa9);
  fVar1 = anon_unknown.dwarf_a02a25::fromBase64_helper
                    (input,(qsizetype)inputSize,(char *)output,
                     (QFlagsStorageHelper<QByteArray::Base64Option,_4>)SUB84((ulong)lVar3 >> 0x20,0)
                    );
  truncate((QByteArray *)&stack0xffffffffffffffd8,(char *)fVar1.decodedLength,fVar1._8_8_);
  QByteArray(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  in_RDI->decodingStatus = fVar1.status;
  ~QByteArray((QByteArray *)0x4ba034);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return pFVar2;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::FromBase64Result QByteArray::fromBase64Encoding(const QByteArray &base64, Base64Options options)
{
    const auto base64Size = base64.size();
    QByteArray result((base64Size * 3) / 4, Qt::Uninitialized);
    const auto base64result = fromBase64_helper(base64.data(),
                                                base64Size,
                                                const_cast<char *>(result.constData()),
                                                options);
    result.truncate(base64result.decodedLength);
    return { std::move(result), base64result.status };
}